

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DatatypeValidator::serialize(DatatypeValidator *this,XSerializeEngine *serEng)

{
  DatatypeValidator *pDVar1;
  RegularExpression *this_00;
  XMLCh *toWrite;
  XMLCh *typeUri;
  ArrayJanitor<char16_t> janName;
  XMLCh *typeLocalName;
  XMLCh *typeLocalName_1;
  int flag;
  int type;
  
  if (serEng->fStoreLoad == 0) {
    XSerializeEngine::operator<<(serEng,this->fAnonymous);
    XSerializeEngine::operator<<(serEng,this->fFinite);
    XSerializeEngine::operator<<(serEng,this->fBounded);
    XSerializeEngine::operator<<(serEng,this->fNumeric);
    XSerializeEngine::operator<<(serEng,this->fWhiteSpace);
    XSerializeEngine::operator<<(serEng,this->fFinalSet);
    XSerializeEngine::operator<<(serEng,this->fFacetsDefined);
    XSerializeEngine::operator<<(serEng,this->fFixed);
    XSerializeEngine::operator<<(serEng,this->fType);
    XSerializeEngine::operator<<(serEng,this->fOrdered);
    storeDV(serEng,this->fBaseValidator);
    XTemplateSerializer::storeObject(this->fFacets,serEng);
    XSerializeEngine::writeString(serEng,this->fPattern,0,false);
    if (this->fTypeUri != L"") {
      if (this->fTypeUri == (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
        XSerializeEngine::operator<<(serEng,-2);
        toWrite = this->fTypeLocalName;
      }
      else {
        XSerializeEngine::operator<<(serEng,-3);
        XSerializeEngine::writeString(serEng,this->fTypeLocalName,0,false);
        toWrite = this->fTypeUri;
      }
      XSerializeEngine::writeString(serEng,toWrite,0,false);
      return;
    }
    XSerializeEngine::operator<<(serEng,-1);
    return;
  }
  XSerializeEngine::operator>>(serEng,&this->fAnonymous);
  XSerializeEngine::operator>>(serEng,&this->fFinite);
  XSerializeEngine::operator>>(serEng,&this->fBounded);
  XSerializeEngine::operator>>(serEng,&this->fNumeric);
  XSerializeEngine::operator>>(serEng,&this->fWhiteSpace);
  XSerializeEngine::operator>>(serEng,&this->fFinalSet);
  XSerializeEngine::operator>>(serEng,&this->fFacetsDefined);
  XSerializeEngine::operator>>(serEng,&this->fFixed);
  XSerializeEngine::operator>>(serEng,&type);
  this->fType = type;
  XSerializeEngine::operator>>(serEng,&type);
  this->fOrdered = type;
  pDVar1 = loadDV(serEng);
  this->fBaseValidator = pDVar1;
  XTemplateSerializer::loadObject(&this->fFacets,0x1d,true,serEng);
  XSerializeEngine::readString(serEng,&this->fPattern);
  XSerializeEngine::operator>>(serEng,&flag);
  if (flag == -2) {
    XSerializeEngine::readString(serEng,&typeLocalName);
    ArrayJanitor<char16_t>::ArrayJanitor(&janName,typeLocalName,this->fMemoryManager);
    setTypeName(this,typeLocalName);
  }
  else {
    if (flag == -1) {
      setTypeName(this,(XMLCh *)0x0);
      goto LAB_002ebe7c;
    }
    XSerializeEngine::readString(serEng,&typeLocalName_1);
    ArrayJanitor<char16_t>::ArrayJanitor(&janName,typeLocalName_1,this->fMemoryManager);
    XSerializeEngine::readString(serEng,&typeUri);
    ArrayJanitor<char16_t>::ArrayJanitor
              ((ArrayJanitor<char16_t> *)&typeLocalName,typeUri,this->fMemoryManager);
    setTypeName(this,typeLocalName_1,typeUri);
    ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&typeLocalName);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&janName);
LAB_002ebe7c:
  this_00 = (RegularExpression *)XMemory::operator_new(0x70,this->fMemoryManager);
  RegularExpression::RegularExpression(this_00,this->fPattern,L"X",this->fMemoryManager);
  this->fRegex = this_00;
  return;
}

Assistant:

void DatatypeValidator::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {
        serEng<<fAnonymous;
        serEng<<fFinite;
        serEng<<fBounded;
        serEng<<fNumeric;

        serEng<<fWhiteSpace;
        serEng<<fFinalSet;
        serEng<<fFacetsDefined;
        serEng<<fFixed;

        serEng<<(int)fType;
        serEng<<(int)fOrdered;

        storeDV(serEng, fBaseValidator);

        /***
         *  Serialize RefHashTableOf<KVStringPair>
         ***/
        XTemplateSerializer::storeObject(fFacets, serEng);

        serEng.writeString(fPattern);

        if (fTypeUri==XMLUni::fgZeroLenString)
        {
            serEng<<TYPENAME_ZERO;
        }
        else if (fTypeUri == SchemaSymbols::fgURI_SCHEMAFORSCHEMA)
        {
            serEng<<TYPENAME_S4S;
            serEng.writeString(fTypeLocalName);
        }
        else
        {        
            serEng<<TYPENAME_NORMAL;
            serEng.writeString(fTypeLocalName);
            serEng.writeString(fTypeUri);
        }

        /***
         * don't serialize 
         *       fRegex
         ***/    
    }
    else
    {
        serEng>>fAnonymous;
        serEng>>fFinite;
        serEng>>fBounded;
        serEng>>fNumeric;

        serEng>>fWhiteSpace;
        serEng>>fFinalSet;
        serEng>>fFacetsDefined;
        serEng>>fFixed;

        int type;
        serEng>>type;
        fType=(ValidatorType)type;

        serEng>>type;
        fOrdered = (XSSimpleTypeDefinition::ORDERING)type;


        fBaseValidator = loadDV(serEng);

        /***
         *
         *  Deserialize RefHashTableOf<KVStringPair>
         *
         ***/
        XTemplateSerializer::loadObject(&fFacets, 29, true, serEng);
        serEng.readString(fPattern);       

        /***
         *   Recreate through setTypeName()
         *       fTypeName
         ***/

        int flag;
        serEng>>flag;

        if ( TYPENAME_ZERO == flag )
        {
            setTypeName(0);
        }
        else if ( TYPENAME_S4S == flag )
        {
            XMLCh* typeLocalName;
            serEng.readString(typeLocalName);
            ArrayJanitor<XMLCh> janName(typeLocalName, fMemoryManager);

            setTypeName(typeLocalName);
        }
        else // TYPENAME_NORMAL
        {
            XMLCh* typeLocalName;
            serEng.readString(typeLocalName);
            ArrayJanitor<XMLCh> janName(typeLocalName, fMemoryManager);

            XMLCh* typeUri;
            serEng.readString(typeUri);
            ArrayJanitor<XMLCh> janUri(typeUri, fMemoryManager);

            setTypeName(typeLocalName, typeUri);
        }

        /***
         * don't serialize fRegex
         ***/
        fRegex = new (fMemoryManager) RegularExpression(fPattern, SchemaSymbols::fgRegEx_XOption, fMemoryManager);

    }

}